

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

ParsedNumber<long_long> * QtPrivate::toSignedInteger(QByteArrayView data,int base)

{
  long lVar1;
  QByteArrayView num;
  bool bVar2;
  storage_type *in_RSI;
  ParsedNumber<long_long> *in_RDI;
  long in_FS_OFFSET;
  QSimpleParsedNumber<long_long> QVar3;
  QSimpleParsedNumber<long_long> r;
  ParsedNumber<long_long> *pPVar4;
  longlong local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar4 = in_RDI;
  bVar2 = QByteArrayView::isEmpty((QByteArrayView *)0x1466e8);
  if (bVar2) {
    ParsedNumber<long_long>::ParsedNumber(in_RDI);
  }
  else {
    local_28 = -0x5555555555555556;
    num.m_data = in_RSI;
    num.m_size = -0x5555555555555556;
    QVar3 = QLocaleData::bytearrayToLongLong(num,(int)((ulong)pPVar4 >> 0x20));
    local_28 = QVar3.result;
    bVar2 = QSimpleParsedNumber<long_long>::ok((QSimpleParsedNumber<long_long> *)&local_28);
    if (bVar2) {
      ParsedNumber<long_long>::ParsedNumber(in_RDI,local_28);
    }
    else {
      ParsedNumber<long_long>::ParsedNumber(in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pPVar4;
  }
  __stack_chk_fail();
}

Assistant:

auto QtPrivate::toSignedInteger(QByteArrayView data, int base) -> ParsedNumber<qlonglong>
{
#if defined(QT_CHECK_RANGE)
    if (base != 0 && (base < 2 || base > 36)) {
        qWarning("QByteArray::toIntegral: Invalid base %d", base);
        base = 10;
    }
#endif
    if (data.isEmpty())
        return {};

    const QSimpleParsedNumber r = QLocaleData::bytearrayToLongLong(data, base);
    if (r.ok())
        return ParsedNumber(r.result);
    return {};
}